

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::can_flip(dxt_image *this,uint axis_index)

{
  uint d;
  uint axis_index_local;
  dxt_image *this_local;
  bool local_1;
  
  if ((((this->m_format == cETC1) || (this->m_format == cETC2)) || (this->m_format == cETC2A)) ||
     ((this->m_format == cETC1S || (this->m_format == cETC2AS)))) {
    local_1 = false;
  }
  else {
    if (axis_index == 0) {
      d = this->m_width;
    }
    else {
      d = this->m_height;
    }
    if (((d & 3) == 0) || (d < 5)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool dxt_image::can_flip(uint axis_index) {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  uint d;
  if (axis_index)
    d = m_height;
  else
    d = m_width;

  if (d & 3) {
    if (d > 4)
      return false;
  }

  return true;
}